

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdaux.cpp
# Opt level: O0

void sqstd_printcallstack(HSQUIRRELVM v)

{
  SQPRINTFUNCTION p_Var1;
  SQRESULT SVar2;
  SQChar *pSVar3;
  char *pcVar4;
  HSQUIRRELVM in_RDI;
  SQBool bval;
  SQChar *src;
  SQChar *fn;
  SQInteger seq;
  SQChar *name;
  SQInteger level;
  SQChar *s;
  SQFloat f;
  SQInteger i;
  SQStackInfos si;
  SQPRINTFUNCTION pf;
  undefined4 in_stack_ffffffffffffff88;
  SQObjectType in_stack_ffffffffffffff8c;
  HSQUIRRELVM in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  SQStackInfos *si_00;
  SQInteger level_00;
  HSQUIRRELVM pSVar5;
  long lVar6;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  SQUnsignedInteger in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  HSQUIRRELVM local_20;
  undefined8 local_18;
  
  p_Var1 = sq_geterrorfunc(in_RDI);
  if (p_Var1 != (SQPRINTFUNCTION)0x0) {
    pSVar5 = (HSQUIRRELVM)0x1;
    level_00 = 0;
    si_00 = (SQStackInfos *)0x0;
    (*p_Var1)(in_RDI,"\nCALLSTACK\n");
    while (SVar2 = sq_stackinfos(pSVar5,level_00,si_00), -1 < SVar2) {
      in_stack_ffffffffffffff98 = "unknown";
      in_stack_ffffffffffffffa0 = (HSQUIRRELVM)"unknown";
      if (in_stack_ffffffffffffffd8 != (HSQUIRRELVM)0x0) {
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffd8;
      }
      if (local_20 != (HSQUIRRELVM)0x0) {
        in_stack_ffffffffffffff98 = (char *)local_20;
      }
      (*p_Var1)(in_RDI,"*FUNCTION [%s()] %s line [%d]\n",in_stack_ffffffffffffffa0,
                in_stack_ffffffffffffff98,local_18);
      pSVar5 = (HSQUIRRELVM)
               ((long)&(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1);
    }
    (*p_Var1)(in_RDI,"\nLOCALS\n");
    for (lVar6 = 0; lVar6 < 10; lVar6 = lVar6 + 1) {
      pSVar5 = (HSQUIRRELVM)0x0;
      while (pSVar3 = sq_getlocal(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
            pSVar3 != (SQChar *)0x0) {
        pSVar5 = (HSQUIRRELVM)
                 ((long)&(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1);
        in_stack_ffffffffffffff8c =
             sq_gettype(in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (in_stack_ffffffffffffff8c == OT_USERPOINTER) {
          (*p_Var1)(in_RDI,"[%s] USERPOINTER\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_NULL) {
          (*p_Var1)(in_RDI,"[%s] NULL\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_BOOL) {
          sq_getbool((HSQUIRRELVM)in_stack_ffffffffffffff98,(SQInteger)in_stack_ffffffffffffff90,
                     (SQBool *)CONCAT44(0x1000008,in_stack_ffffffffffffff88));
          pcVar4 = "false";
          if (in_stack_ffffffffffffff90 == (HSQUIRRELVM)0x1) {
            pcVar4 = "true";
          }
          (*p_Var1)(in_RDI,"[%s] %s\n",pSVar3,pcVar4);
        }
        else if (in_stack_ffffffffffffff8c == OT_INTEGER) {
          sq_getinteger(pSVar5,(SQInteger)in_stack_ffffffffffffffa0,
                        (SQInteger *)in_stack_ffffffffffffff98);
          (*p_Var1)(in_RDI,"[%s] %d\n",pSVar3,in_stack_ffffffffffffffd0);
        }
        else if (in_stack_ffffffffffffff8c == OT_FLOAT) {
          sq_getfloat(pSVar5,(SQInteger)in_stack_ffffffffffffffa0,
                      (SQFloat *)in_stack_ffffffffffffff98);
          (*p_Var1)(in_RDI,"[%s] %.14g\n",(double)in_stack_ffffffffffffffcc,pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_STRING) {
          sq_getstring((HSQUIRRELVM)in_stack_ffffffffffffff98,(SQInteger)in_stack_ffffffffffffff90,
                       (SQChar **)CONCAT44(0x8000010,in_stack_ffffffffffffff88));
          (*p_Var1)(in_RDI,"[%s] \"%s\"\n",pSVar3,local_40);
        }
        else if (in_stack_ffffffffffffff8c == OT_ARRAY) {
          (*p_Var1)(in_RDI,"[%s] ARRAY\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_CLOSURE) {
          (*p_Var1)(in_RDI,"[%s] CLOSURE\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_NATIVECLOSURE) {
          (*p_Var1)(in_RDI,"[%s] NATIVECLOSURE\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_GENERATOR) {
          (*p_Var1)(in_RDI,"[%s] GENERATOR\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_THREAD) {
          (*p_Var1)(in_RDI,"[%s] THREAD\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_CLASS) {
          (*p_Var1)(in_RDI,"[%s] CLASS\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_WEAKREF) {
          (*p_Var1)(in_RDI,"[%s] WEAKREF\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_TABLE) {
          (*p_Var1)(in_RDI,"[%s] TABLE\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_USERDATA) {
          (*p_Var1)(in_RDI,"[%s] USERDATA\n",pSVar3);
        }
        else if (in_stack_ffffffffffffff8c == OT_INSTANCE) {
          (*p_Var1)(in_RDI,"[%s] INSTANCE\n",pSVar3);
        }
        sq_pop(in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
    }
  }
  return;
}

Assistant:

void sqstd_printcallstack(HSQUIRRELVM v)
{
    SQPRINTFUNCTION pf = sq_geterrorfunc(v);
    if(pf) {
        SQStackInfos si;
        SQInteger i;
        SQFloat f;
        const SQChar *s;
        SQInteger level=1; //1 is to skip this function that is level 0
        const SQChar *name=0;
        SQInteger seq=0;
        pf(v,_SC("\nCALLSTACK\n"));
        while(SQ_SUCCEEDED(sq_stackinfos(v,level,&si)))
        {
            const SQChar *fn=_SC("unknown");
            const SQChar *src=_SC("unknown");
            if(si.funcname)fn=si.funcname;
            if(si.source)src=si.source;
            pf(v,_SC("*FUNCTION [%s()] %s line [%d]\n"),fn,src,si.line);
            level++;
        }
        level=0;
        pf(v,_SC("\nLOCALS\n"));

        for(level=0;level<10;level++){
            seq=0;
            while((name = sq_getlocal(v,level,seq)))
            {
                seq++;
                switch(sq_gettype(v,-1))
                {
                case OT_NULL:
                    pf(v,_SC("[%s] NULL\n"),name);
                    break;
                case OT_INTEGER:
                    sq_getinteger(v,-1,&i);
                    pf(v,_SC("[%s] %d\n"),name,i);
                    break;
                case OT_FLOAT:
                    sq_getfloat(v,-1,&f);
                    pf(v,_SC("[%s] %.14g\n"),name,f);
                    break;
                case OT_USERPOINTER:
                    pf(v,_SC("[%s] USERPOINTER\n"),name);
                    break;
                case OT_STRING:
                    sq_getstring(v,-1,&s);
                    pf(v,_SC("[%s] \"%s\"\n"),name,s);
                    break;
                case OT_TABLE:
                    pf(v,_SC("[%s] TABLE\n"),name);
                    break;
                case OT_ARRAY:
                    pf(v,_SC("[%s] ARRAY\n"),name);
                    break;
                case OT_CLOSURE:
                    pf(v,_SC("[%s] CLOSURE\n"),name);
                    break;
                case OT_NATIVECLOSURE:
                    pf(v,_SC("[%s] NATIVECLOSURE\n"),name);
                    break;
                case OT_GENERATOR:
                    pf(v,_SC("[%s] GENERATOR\n"),name);
                    break;
                case OT_USERDATA:
                    pf(v,_SC("[%s] USERDATA\n"),name);
                    break;
                case OT_THREAD:
                    pf(v,_SC("[%s] THREAD\n"),name);
                    break;
                case OT_CLASS:
                    pf(v,_SC("[%s] CLASS\n"),name);
                    break;
                case OT_INSTANCE:
                    pf(v,_SC("[%s] INSTANCE\n"),name);
                    break;
                case OT_WEAKREF:
                    pf(v,_SC("[%s] WEAKREF\n"),name);
                    break;
                case OT_BOOL:{
                    SQBool bval;
                    sq_getbool(v,-1,&bval);
                    pf(v,_SC("[%s] %s\n"),name,bval == SQTrue ? _SC("true"):_SC("false"));
                             }
                    break;
                default: assert(0); break;
                }
                sq_pop(v,1);
            }
        }
    }
}